

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ir.cc
# Opt level: O0

void __thiscall ir_visit_if_Test::~ir_visit_if_Test(ir_visit_if_Test *this)

{
  ir_visit_if_Test *this_local;
  
  ~ir_visit_if_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ir, visit_if) {  // NOLINT
    Context c;
    auto &mod = c.generator("test");
    auto &var1 = mod.var("a", 2);
    auto &var2 = mod.var("b", 2);

    auto if_stmt = IfStmt(var1.eq(var2));
    if_stmt.add_then_stmt(var1.assign(constant(2, 2)));
    if_stmt.add_else_stmt(var2.assign(constant(2, 2)));

    VarVisitor visitor;
    visitor.visit_root(if_stmt.ast_node());
    EXPECT_EQ(visitor.vars.size(), 2);
    EXPECT_EQ(visitor.max_level, 2);
    EXPECT_EQ(visitor.current_level(), 0);
}